

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata_test.cc
# Opt level: O0

void __thiscall
libaom_examples::anon_unknown_0::MultilayerMetadataTest_DoubleConversion_Test::TestBody
          (MultilayerMetadataTest_DoubleConversion_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  DepthRepresentationElement e;
  bool *in_stack_ffffffffffffff48;
  AssertionResult *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  DepthRepresentationElement *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff7c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff80;
  string local_68 [24];
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffe0;
  
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  TestConversion(in_stack_ffffffffffffffe0);
  double_to_depth_representation_element
            ((double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0xdce81e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               &in_stack_ffffffffffffff70->sign_flag,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_68);
    testing::Message::~Message((Message *)0xdce8cd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xdce95c);
  if (bVar1) {
    bVar1 = double_to_depth_representation_element
                      ((double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff70);
    type = (CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c) ^ 0xff000000) & 0x1ffffff;
    testing::AssertionResult::AssertionResult<bool>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0xdce99b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff80);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff80,type,&in_stack_ffffffffffffff70->sign_flag,
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      testing::Message::~Message((Message *)0xdcea47);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xdceacb);
  }
  return;
}

Assistant:

TEST(MultilayerMetadataTest, DoubleConversion) {
  TestConversion(0.0);
  TestConversion(1.789456e-5);
  TestConversion(-1.789456e-5);
  TestConversion(42);
  TestConversion(6.7894564456);
  TestConversion(6.7894564456e10);
  TestConversion(-6.7894564456e10);

  DepthRepresentationElement e;
  // Too small.
  ASSERT_FALSE(double_to_depth_representation_element(1e-10, &e));
  // Too big.
  ASSERT_FALSE(double_to_depth_representation_element(1e+30, &e));
}